

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# section.cpp
# Opt level: O2

void sect_String(char *s)

{
  bool bVar1;
  size_t sVar2;
  
  bVar1 = checkcodesection();
  if (bVar1) {
    sVar2 = strlen(s);
    bVar1 = reserveSpace((uint32_t)sVar2);
    if (bVar1) {
      for (; *s != '\0'; s = (char *)((uint8_t *)s + 1)) {
        writebyte(*s);
      }
    }
  }
  return;
}

Assistant:

void sect_String(char const *s)
{
	if (!checkcodesection())
		return;
	if (!reserveSpace(strlen(s)))
		return;

	while (*s)
		writebyte(*s++);
}